

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_att.cc
# Opt level: O0

X509_ATTRIBUTE *
X509_ATTRIBUTE_create_by_OBJ(X509_ATTRIBUTE **attr,ASN1_OBJECT *obj,int atrtype,void *data,int len)

{
  int iVar1;
  X509_ATTRIBUTE *local_40;
  X509_ATTRIBUTE *ret;
  int len_local;
  void *data_local;
  int attrtype_local;
  ASN1_OBJECT *obj_local;
  X509_ATTRIBUTE **attr_local;
  
  if ((attr == (X509_ATTRIBUTE **)0x0) || (*attr == (X509_ATTRIBUTE *)0x0)) {
    local_40 = X509_ATTRIBUTE_new();
    if (local_40 == (X509_ATTRIBUTE *)0x0) {
      return (X509_ATTRIBUTE *)0x0;
    }
  }
  else {
    local_40 = *attr;
  }
  iVar1 = X509_ATTRIBUTE_set1_object(local_40,obj);
  if ((iVar1 == 0) || (iVar1 = X509_ATTRIBUTE_set1_data(local_40,atrtype,data,len), iVar1 == 0)) {
    if ((attr == (X509_ATTRIBUTE **)0x0) || (local_40 != *attr)) {
      X509_ATTRIBUTE_free(local_40);
    }
    attr_local = (X509_ATTRIBUTE **)0x0;
  }
  else {
    if ((attr != (X509_ATTRIBUTE **)0x0) && (*attr == (X509_ATTRIBUTE *)0x0)) {
      *attr = local_40;
    }
    attr_local = (X509_ATTRIBUTE **)local_40;
  }
  return (X509_ATTRIBUTE *)attr_local;
}

Assistant:

X509_ATTRIBUTE *X509_ATTRIBUTE_create_by_OBJ(X509_ATTRIBUTE **attr,
                                             const ASN1_OBJECT *obj,
                                             int attrtype, const void *data,
                                             int len) {
  X509_ATTRIBUTE *ret;

  if ((attr == NULL) || (*attr == NULL)) {
    if ((ret = X509_ATTRIBUTE_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = *attr;
  }

  if (!X509_ATTRIBUTE_set1_object(ret, obj)) {
    goto err;
  }
  if (!X509_ATTRIBUTE_set1_data(ret, attrtype, data, len)) {
    goto err;
  }

  if ((attr != NULL) && (*attr == NULL)) {
    *attr = ret;
  }
  return ret;
err:
  if ((attr == NULL) || (ret != *attr)) {
    X509_ATTRIBUTE_free(ret);
  }
  return NULL;
}